

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_ineighbor_alltoall_
               (void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *senddtype,void *recvbuf,
               MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *comm,MPIABI_Fint *request,
               MPIABI_Fint *ierror)

{
  MPIABI_Fint *recvtype_local;
  MPIABI_Fint *recvcount_local;
  void *recvbuf_local;
  MPIABI_Fint *senddtype_local;
  MPIABI_Fint *sendcount_local;
  void *sendbuf_local;
  
  mpi_ineighbor_alltoall_
            (sendbuf,sendcount,senddtype,recvbuf,recvcount,recvtype,comm,request,ierror);
  return;
}

Assistant:

void mpiabi_ineighbor_alltoall_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * senddtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ineighbor_alltoall_(
    sendbuf,
    sendcount,
    senddtype,
    recvbuf,
    recvcount,
    recvtype,
    comm,
    request,
    ierror
  );
}